

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_simple
                   (char_t *s,char_t end_quote)

{
  byte *pbVar1;
  byte bVar2;
  char_t *pcVar3;
  bool bVar4;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  do {
    if (((anonymous_namespace)::chartype_table[(byte)*s] & 2) == 0) {
      if (((anonymous_namespace)::chartype_table[((byte *)s)[1]] & 2) != 0) {
        s = (char_t *)((byte *)s + 1);
        goto LAB_00106f53;
      }
      if (((anonymous_namespace)::chartype_table[((byte *)s)[2]] & 2) != 0) {
        s = (char_t *)((byte *)s + 2);
        goto LAB_00106f53;
      }
      pbVar1 = (byte *)s + 3;
      bVar4 = ((anonymous_namespace)::chartype_table[((byte *)s)[3]] & 2) == 0;
      s = (char_t *)((byte *)s + 4);
      if (!bVar4) {
        s = (char_t *)pbVar1;
      }
    }
    else {
LAB_00106f53:
      bVar4 = false;
    }
    if (!bVar4) {
      bVar2 = *s;
      if (bVar2 == end_quote) {
        pcVar3 = gap::flush(&local_38,s);
        *pcVar3 = '\0';
        return (char_t *)((byte *)s + 1);
      }
      if (bVar2 == 0x26) {
        s = strconv_escape(s,&local_38);
      }
      else {
        if (bVar2 == 0) {
          return (char_t *)0x0;
        }
        s = (char_t *)((byte *)s + 1);
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_simple(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_attr));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}